

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O3

void __thiscall rest_rpc::rpc_client::async_connect(rpc_client *this)

{
  char *str;
  error_code __ec;
  address addr;
  error_code local_68;
  endpoint local_58;
  address local_34;
  
  str = (this->host_)._M_dataplus._M_p;
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  asio::ip::make_address(&local_34,str,&local_68);
  __ec._0_8_ = local_68._0_8_ & 0xffffffff;
  if (local_68._M_value != 0) {
    __ec._M_cat = local_68._M_cat;
    std::system_error::system_error((system_error *)&local_58,__ec);
    asio::detail::throw_exception<std::system_error>((system_error *)&local_58);
    std::system_error::~system_error((system_error *)&local_58);
  }
  asio::ip::detail::endpoint::endpoint(&local_58,&local_34,this->port_);
  local_68._0_8_ = this;
  asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
  async_connect<rest_rpc::rpc_client::async_connect()::_lambda(std::error_code_const&)_1_>
            ((basic_socket<asio::ip::tcp,asio::any_io_executor> *)&this->socket_,
             (endpoint_type *)&local_58,(anon_class_8_1_8991fb9c *)&local_68);
  return;
}

Assistant:

void async_connect() {
    assert(port_ != 0);
    auto addr = asio::ip::address::from_string(host_);
    socket_.async_connect({addr, port_}, [this](const asio::error_code &ec) {
      if (has_connected_ || stop_client_) {
        return;
      }

      if (ec) {
        // std::cout << ec.message() << std::endl;

        has_connected_ = false;

        if (reconnect_cnt_ <= 0) {
          return;
        }

        if (reconnect_cnt_ > 0) {
          reconnect_cnt_--;
        }

        async_reconnect();
      } else {
        // std::cout<<"connected ok"<<std::endl;
        if (is_ssl()) {
          handshake();
          return;
        }

        has_connected_ = true;
        do_read();
        resend_subscribe();
        if (has_wait_)
          conn_cond_.notify_one();
      }
    });
  }